

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_ManResetRefs(Aig_Man_t *p)

{
  ulong *puVar1;
  void *pvVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  
  pVVar4 = p->vObjs;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      if (pVVar4->pArray[lVar3] != (void *)0x0) {
        puVar1 = (ulong *)((long)pVVar4->pArray[lVar3] + 0x18);
        *puVar1 = *puVar1 & 0xffffffff0000003f;
        pVVar4 = p->vObjs;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar4->nSize);
    if (0 < pVVar4->nSize) {
      lVar3 = 0;
      do {
        pvVar2 = pVVar4->pArray[lVar3];
        if (pvVar2 != (void *)0x0) {
          uVar5 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
          if (uVar5 != 0) {
            *(ulong *)(uVar5 + 0x18) =
                 *(ulong *)(uVar5 + 0x18) & 0xffffffff0000003f |
                 (ulong)((int)*(ulong *)(uVar5 + 0x18) + 0x40U & 0xffffffc0);
          }
          uVar5 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
          if (uVar5 != 0) {
            *(ulong *)(uVar5 + 0x18) =
                 *(ulong *)(uVar5 + 0x18) & 0xffffffff0000003f |
                 (ulong)((int)*(ulong *)(uVar5 + 0x18) + 0x40U & 0xffffffc0);
          }
        }
        lVar3 = lVar3 + 1;
        pVVar4 = p->vObjs;
      } while (lVar3 < pVVar4->nSize);
    }
  }
  return;
}

Assistant:

void Aig_ManResetRefs( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        pObj->nRefs = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjFanin0(pObj) )
            Aig_ObjFanin0(pObj)->nRefs++;
        if ( Aig_ObjFanin1(pObj) )
            Aig_ObjFanin1(pObj)->nRefs++;
    }
}